

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

bool __thiscall
soul::AST::TypeMetaFunction::checkSourceType(TypeMetaFunction *this,Type *sourceType)

{
  Category CVar1;
  bool bVar2;
  
  bVar2 = true;
  switch(this->operation) {
  case makeConst:
    return (bool)(sourceType->isConstant ^ 1);
  case elementType:
    if ((sourceType->category & ~primitive) != vector) {
      return (sourceType->primitiveType).type - complex32 < 2;
    }
    break;
  case primitiveType:
    bVar2 = sourceType->category != structure && sourceType->category != array;
    break;
  case size:
    CVar1 = sourceType->category;
    if ((CVar1 != vector) && (CVar1 != array || sourceType->boundingSize == 0)) {
      return (CVar1 & ~primitive) == wrap;
    }
  }
  return bVar2;
}

Assistant:

bool checkSourceType (const Type& sourceType) const
        {
            if (operation == Op::size)           return canTakeSizeOf (sourceType);
            if (operation == Op::makeConst)      return ! sourceType.isConst();
            if (operation == Op::elementType)    return sourceType.isArrayOrVector() || sourceType.isComplex();
            if (operation == Op::primitiveType)  return ! (sourceType.isArray() || sourceType.isStruct());

            return true;
        }